

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_shift_tail(run_container_t *run,int32_t count,int32_t distance)

{
  int iVar1;
  int32_t dstpos;
  int32_t srcpos;
  int32_t distance_local;
  int32_t count_local;
  run_container_t *run_local;
  
  if ((0 < distance) && (run->capacity < count + distance)) {
    run_container_grow(run,count + distance,true);
  }
  iVar1 = run->n_runs - count;
  memmove(run->runs + (iVar1 + distance),run->runs + iVar1,(long)count << 2);
  run->n_runs = distance + run->n_runs;
  return;
}

Assistant:

static inline void run_container_shift_tail(run_container_t* run,
                                            int32_t count, int32_t distance) {
    if (distance > 0) {
        if (run->capacity < count+distance) {
            run_container_grow(run, count+distance, true);
        }
    }
    int32_t srcpos = run->n_runs - count;
    int32_t dstpos = srcpos + distance;
    memmove(&(run->runs[dstpos]), &(run->runs[srcpos]), sizeof(rle16_t) * count);
    run->n_runs += distance;
}